

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O2

Vec_Wec_t * Gia_Iso2ManDerivePoClasses(Gia_Man_t *pGia)

{
  int iVar1;
  uint p;
  int nCapMin;
  uint uVar2;
  int iVar3;
  int i;
  Vec_Int_t *pVVar4;
  Gia_Obj_t *pGVar5;
  Vec_Int_t *p_00;
  Hsh_IntMan_t *p_01;
  Vec_Int_t *p_02;
  Vec_Wrd_t *__ptr;
  word *pwVar6;
  ulong uVar7;
  Hsh_IntObj_t *pHVar8;
  uint *puVar9;
  int *piVar10;
  uint *puVar11;
  Vec_Wec_t *p_03;
  ulong uVar12;
  long lVar13;
  int *piVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  
  pVVar4 = Vec_IntAlloc(pGia->vCos->nSize - pGia->nRegs);
  for (iVar15 = 0; iVar15 < pGia->vCos->nSize - pGia->nRegs; iVar15 = iVar15 + 1) {
    pGVar5 = Gia_ManCo(pGia,iVar15);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    Vec_IntPush(pVVar4,pGVar5->Value);
  }
  p_00 = Vec_IntAlloc(100);
  p = pVVar4->nSize;
  p_01 = (Hsh_IntMan_t *)calloc(1,0x20);
  p_01->nSize = 1;
  p_01->vData = pVVar4;
  iVar15 = Abc_PrimeCudd(p);
  p_02 = Vec_IntStartFull(iVar15);
  p_01->vTable = p_02;
  __ptr = (Vec_Wrd_t *)malloc(0x10);
  uVar2 = p;
  if (p - 1 < 0xf) {
    uVar2 = 0x10;
  }
  __ptr->nSize = 0;
  __ptr->nCap = uVar2;
  if (uVar2 == 0) {
    pwVar6 = (word *)0x0;
  }
  else {
    pwVar6 = (word *)malloc((long)(int)uVar2 << 3);
  }
  __ptr->pArray = pwVar6;
  if ((int)p < 1) {
    p = 0;
  }
  p_01->vObjs = __ptr;
  uVar17 = 0;
  do {
    iVar15 = 1;
    if (uVar17 == p) {
      Vec_IntFree(p_02);
      free(__ptr->pArray);
      free(__ptr);
      free(p_01);
      Vec_IntFree(pVVar4);
      iVar3 = p_00->nSize;
      if ((long)iVar3 != 0) {
        iVar15 = *p_00->pArray;
        for (lVar13 = 1; lVar13 < iVar3; lVar13 = lVar13 + 1) {
          iVar16 = p_00->pArray[lVar13];
          if (iVar15 <= iVar16) {
            iVar15 = iVar16;
          }
        }
        iVar15 = iVar15 + 1;
      }
      p_03 = Vec_WecAlloc(iVar15);
      p_03->nSize = iVar15;
      iVar16 = 0;
      if (iVar3 < 1) {
        iVar3 = 0;
        iVar16 = 0;
      }
      for (; iVar3 != iVar16; iVar16 = iVar16 + 1) {
        i = Vec_IntEntry(p_00,iVar16);
        if (iVar15 <= i) {
          iVar1 = i + 1;
          nCapMin = iVar15 * 2;
          if (iVar15 * 2 <= iVar1) {
            nCapMin = iVar1;
          }
          Vec_WecGrow(p_03,nCapMin);
          p_03->nSize = iVar1;
          iVar15 = iVar1;
        }
        pVVar4 = Vec_WecEntry(p_03,i);
        Vec_IntPush(pVVar4,iVar16);
      }
      Vec_IntFree(p_00);
      return p_03;
    }
    if (p_02->nSize < __ptr->nSize) {
      uVar2 = Abc_PrimeCudd(p_02->nSize * 2);
      Vec_IntGrow(p_02,uVar2);
      uVar7 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar7 = 0;
      }
      for (uVar12 = 0; uVar7 != uVar12; uVar12 = uVar12 + 1) {
        p_02->pArray[uVar12] = -1;
      }
      p_02->nSize = uVar2;
      for (iVar15 = 0; iVar15 < __ptr->nSize; iVar15 = iVar15 + 1) {
        pHVar8 = Hsh_IntObj(p_01,iVar15);
        puVar9 = Hsh_IntData(p_01,pHVar8->iData);
        iVar3 = Hsh_IntManHash(puVar9,1,p_02->nSize);
        piVar10 = Vec_IntEntryP(p_02,iVar3);
        iVar3 = *piVar10;
        pHVar8 = Hsh_IntObj(p_01,iVar15);
        pHVar8->iNext = iVar3;
        *piVar10 = iVar15;
      }
    }
    puVar9 = Hsh_IntData(p_01,(int)uVar17);
    iVar15 = Hsh_IntManHash(puVar9,1,p_02->nSize);
    piVar10 = Vec_IntEntryP(p_02,iVar15);
    do {
      piVar14 = piVar10;
      pHVar8 = Hsh_IntObj(p_01,*piVar14);
      if (pHVar8 == (Hsh_IntObj_t *)0x0) {
        if (*piVar14 != -1) {
          __assert_fail("*pPlace == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecHsh.h"
                        ,0x138,"int *Hsh_IntManLookup(Hsh_IntMan_t *, unsigned int *)");
        }
        goto LAB_005e694a;
      }
      puVar11 = Hsh_IntData(p_01,pHVar8->iData);
      piVar10 = &pHVar8->iNext;
    } while (*puVar9 != *puVar11);
    if (*piVar14 == -1) {
LAB_005e694a:
      iVar15 = __ptr->nSize;
      *piVar14 = iVar15;
      if (iVar15 == __ptr->nCap) {
        uVar2 = iVar15 * 2;
        if (iVar15 < 0x10) {
          uVar2 = 0x10;
        }
        pwVar6 = __ptr->pArray;
        if (iVar15 < (int)uVar2) {
          if (pwVar6 == (word *)0x0) {
            pwVar6 = (word *)malloc((ulong)uVar2 << 3);
          }
          else {
            pwVar6 = (word *)realloc(pwVar6,(ulong)uVar2 << 3);
          }
          __ptr->pArray = pwVar6;
          if (pwVar6 == (word *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                          ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
          }
          __ptr->nCap = uVar2;
          iVar15 = __ptr->nSize;
        }
      }
      else {
        pwVar6 = __ptr->pArray;
      }
      __ptr->nSize = iVar15 + 1;
      pwVar6[iVar15] = uVar17 | 0xffffffff00000000;
    }
    else {
      pHVar8 = Hsh_IntObj(p_01,*piVar14);
      iVar15 = (int)((ulong)((long)pHVar8 - (long)__ptr->pArray) >> 3);
    }
    Vec_IntPush(p_00,iVar15);
    uVar17 = uVar17 + 1;
  } while( true );
}

Assistant:

Vec_Wec_t * Gia_Iso2ManDerivePoClasses( Gia_Man_t * pGia )
{
    Vec_Wec_t * vEquivs;
    Vec_Int_t * vValues;
    Vec_Int_t * vMap;
    Gia_Obj_t * pObj;
    int i;
    vValues = Vec_IntAlloc( Gia_ManPoNum(pGia) );
    Gia_ManForEachPo( pGia, pObj, i )
        Vec_IntPush( vValues, pObj->Value );
    vMap = Hsh_IntManHashArray( vValues, 1 );
    Vec_IntFree( vValues );
    vEquivs = Vec_WecCreateClasses( vMap );
    Vec_IntFree( vMap );
    return vEquivs;    
}